

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O0

void test_read_format_rar_subblock(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a_00;
  char *v2;
  time_t tVar4;
  la_int64_t v2_00;
  long lVar5;
  la_ssize_t lVar6;
  archive *a;
  archive_entry *ae;
  char acStack_98 [4];
  int size;
  char test_txt [21];
  char local_78 [8];
  char reffile [34];
  undefined1 local_48 [8];
  char buff [64];
  
  memcpy(local_78,"test_read_format_rar_subblock.rar",0x22);
  builtin_strncpy(acStack_98,"test",4);
  size._0_1_ = ' ';
  size._1_1_ = 't';
  size._2_1_ = 'e';
  size._3_1_ = 'x';
  builtin_strncpy(test_txt,"t document\r\n",0xd);
  ae._4_4_ = 0x14;
  extract_reference_file(local_78);
  a_00 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x8c',(uint)(a_00 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x8d',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all((archive *)a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x8e',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  wVar2 = archive_read_open_filename(a_00,local_78,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x8f',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, reffile, 10240)",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x92',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a_00);
  v2 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'\x93',"test.txt","\"test.txt\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar4 = archive_entry_mtime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x94',(wchar_t)tVar4,"(int)archive_entry_mtime(ae)",a_00);
  tVar4 = archive_entry_ctime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x95',(wchar_t)tVar4,"(int)archive_entry_ctime(ae)",a_00);
  tVar4 = archive_entry_atime((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x96',(wchar_t)tVar4,"(int)archive_entry_atime(ae)",a_00);
  v2_00 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'\x97',0x14,"20",v2_00,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'\x98',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  lVar5 = (long)ae._4_4_;
  lVar6 = archive_read_data((archive *)a_00,local_48,(long)ae._4_4_);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x99',(uint)(lVar5 == lVar6),"size == archive_read_data(a, buff, size)",a_00);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'\x9a',local_48,"buff",acStack_98,"test_txt",(long)ae._4_4_,"size",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'\x9b',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'\x9c',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a_00);
  iVar1 = archive_read_next_header((archive *)a_00,(archive_entry **)&a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'\x9f',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_file_count((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'\xa0',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'¡',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free((archive *)a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'¢',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_subblock)
{
  char buff[64];
  const char reffile[] = "test_read_format_rar_subblock.rar";
  const char test_txt[] = "test text document\r\n";
  int size = sizeof(test_txt)-1;
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(20, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(1, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}